

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins_types.c
# Opt level: O1

LY_ERR lyplg_type_parse_int
                 (char *datatype,int base,int64_t min,int64_t max,char *value,size_t value_len,
                 int64_t *ret,ly_err_item **err)

{
  LY_ERR LVar1;
  ushort **ppuVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  
  if (err == (ly_err_item **)0x0) {
    pcVar3 = "err";
  }
  else {
    if (datatype != (char *)0x0) {
      *err = (ly_err_item *)0x0;
      bVar5 = value_len != 0;
      if (bVar5) {
        ppuVar2 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar2 + (long)*value * 2 + 1) & 0x20) != 0) {
          pcVar3 = value + value_len;
          do {
            bVar5 = (char *)value_len != (char *)0x1;
            if ((char *)value_len == (char *)0x1) {
              value_len = 0;
              value = pcVar3;
              break;
            }
            pcVar4 = value + 1;
            value = value + 1;
            value_len = value_len + -1;
          } while ((*(byte *)((long)*ppuVar2 + (long)*pcVar4 * 2 + 1) & 0x20) != 0);
        }
      }
      if ((!(bool)(bVar5 ^ 1U | value == (char *)0x0)) && (*value != '\0')) {
        LVar1 = ly_parse_int(value,value_len,min,max,base,ret);
        if (LVar1 == LY_SUCCESS) {
          return LY_SUCCESS;
        }
        if (LVar1 == LY_EDENIED) {
          pcVar4 = "Value \"%.*s\" is out of type %s min/max bounds.";
          pcVar3 = (char *)value_len;
          value_len = (size_t)value;
        }
        else {
          pcVar4 = "Invalid type %s value \"%.*s\".";
          pcVar3 = datatype;
          datatype = value;
        }
        LVar1 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,pcVar4,pcVar3,value_len,
                           datatype);
        return LVar1;
      }
      LVar1 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                         "Invalid type %s empty value.",datatype);
      return LVar1;
    }
    pcVar3 = "datatype";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar3,
         "lyplg_type_parse_int");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_type_parse_int(const char *datatype, int base, int64_t min, int64_t max, const char *value, size_t value_len,
        int64_t *ret, struct ly_err_item **err)
{
    LY_CHECK_ARG_RET(NULL, err, datatype, LY_EINVAL);

    *err = NULL;

    /* consume leading whitespaces */
    for ( ; value_len && isspace(*value); ++value, --value_len) {}

    if (!value || !value_len || !value[0]) {
        return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid type %s empty value.", datatype);
    }

    switch (ly_parse_int(value, value_len, min, max, base, ret)) {
    case LY_EDENIED:
        return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL,
                "Value \"%.*s\" is out of type %s min/max bounds.", (int)value_len, value, datatype);
    case LY_SUCCESS:
        return LY_SUCCESS;
    default:
        return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL,
                "Invalid type %s value \"%.*s\".", datatype, (int)value_len, value);
    }
}